

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* load(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       *__return_storage_ptr__,istream *in,int col_offset)

{
  bool bVar1;
  istream *piVar2;
  char *pcVar3;
  reference this;
  double local_208;
  int local_1fc;
  string local_1f8 [4];
  int i;
  string token;
  istringstream local_1d8 [8];
  istringstream lin;
  value_type *point;
  string local_40 [8];
  string line;
  int col_offset_local;
  istream *in_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *points;
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__);
  std::__cxx11::string::string(local_40);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(in,local_40);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
    if (*pcVar3 != '%') {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::emplace_back<>(__return_storage_ptr__);
      this = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::back(__return_storage_ptr__);
      std::__cxx11::istringstream::istringstream(local_1d8,local_40,8);
      std::__cxx11::string::string(local_1f8);
      for (local_1fc = 0; local_1fc < col_offset; local_1fc = local_1fc + 1) {
        std::operator>>((istream *)local_1d8,local_1f8);
      }
      while( true ) {
        piVar2 = std::operator>>((istream *)local_1d8,local_1f8);
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
        if (!bVar1) break;
        local_208 = std::__cxx11::stod((string *)local_1f8,(size_t *)0x0);
        std::vector<double,_std::allocator<double>_>::push_back(this,&local_208);
      }
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::istringstream::~istringstream(local_1d8);
    }
  }
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Container> load(std::istream& in, int col_offset)
{
    std::vector<Container> points;
    std::string line;
    while (std::getline(in, line))
    {
        if (line[0] == '%')
            continue;
        points.emplace_back();
        auto& point = points.back();
        std::istringstream lin(line);
        std::string token;
        for (int i = 0; i < col_offset; i++)
            lin >> token;
        while (lin >> token)
            point.push_back(std::stod(token));
    }
    return points;
}